

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  BBox1f BVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  BBox3fa *pBVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  undefined4 uVar16;
  long lVar17;
  uint uVar18;
  size_t *psVar19;
  CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
  *pCVar20;
  long lVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar41;
  float fVar42;
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar39 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar40;
  float fVar47;
  float fVar48;
  undefined1 auVar44 [16];
  float fVar49;
  undefined1 auVar45 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar46;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_198;
  size_t local_190;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  anon_class_16_2_07cfa4d6 local_110;
  ulong local_100;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  fVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.lower;
  fVar3 = time_range->lower;
  if (time_range->lower <= fVar2) {
    fVar3 = fVar2;
  }
  fVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper;
  if (time_range->upper <= fVar2) {
    fVar2 = time_range->upper;
  }
  if (fVar3 <= fVar2) {
    uVar23 = r->_begin;
    local_138 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_148 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_158 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    local_168 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_198 = __return_storage_ptr__->end;
    local_190 = k;
    if (uVar23 < r->_end) {
      do {
        BVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        fVar37 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 super_Geometry.fnumTimeSegments;
        auVar39._0_4_ = BVar4.lower;
        auVar39._8_4_ = BVar4.upper - auVar39._0_4_;
        auVar39._4_4_ = floorf(((fVar3 - auVar39._0_4_) / auVar39._8_4_) * 1.0000002 * fVar37);
        auVar39._0_4_ = ceilf(((fVar2 - auVar39._0_4_) / auVar39._8_4_) * 0.99999976 * fVar37);
        uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar23);
        pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 vertices.items;
        if ((ulong)(uVar5 + 3) < (pBVar6->super_RawBufferView).num) {
          auVar39._8_4_ = 0.0;
          if (0.0 <= auVar39._4_4_) {
            auVar39._8_4_ = auVar39._4_4_;
          }
          uVar12 = (uint)auVar39._8_4_;
          if (fVar37 <= auVar39._0_4_) {
            auVar39._0_4_ = fVar37;
          }
          uVar18 = (uint)auVar39._0_4_;
          bVar8 = uVar18 < uVar12;
          if (uVar12 <= uVar18) {
            uVar13 = (ulong)(int)uVar12;
            psVar19 = &pBVar6[uVar13].super_RawBufferView.stride;
            pCVar20 = this;
            do {
              pcVar7 = ((RawBufferView *)(psVar19 + -2))->ptr_ofs;
              sVar22 = *psVar19;
              lVar17 = sVar22 * uVar5;
              lVar21 = sVar22 * (uVar5 + 1);
              lVar24 = sVar22 * (uVar5 + 2);
              lVar15 = sVar22 * (uVar5 + 3);
              auVar45._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar21 + 0xc)));
              auVar45._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar17 + 0xc)));
              auVar45._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar24 + 0xc)));
              auVar45._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar7 + lVar15 + 0xc)));
              uVar12 = movmskps((int)pCVar20,auVar45);
              pCVar20 = (CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
                         *)(ulong)uVar12;
              if (uVar12 != 0) {
LAB_00aacedc:
                if (!bVar8) goto LAB_00aad385;
                break;
              }
              pfVar1 = (float *)(pcVar7 + lVar17);
              auVar33._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar33._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar33._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar33._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar16 = movmskps((int)lVar17,auVar33);
              if ((~(byte)uVar16 & 7) != 0) goto LAB_00aacedc;
              pfVar1 = (float *)(pcVar7 + lVar21);
              auVar25._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar25._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar25._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar25._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar16 = movmskps(CONCAT31((int3)((uint)uVar16 >> 8),~(byte)uVar16),auVar25);
              if ((~(byte)uVar16 & 7) != 0) goto LAB_00aacedc;
              pfVar1 = (float *)(pcVar7 + lVar24);
              auVar26._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar26._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar26._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar26._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar16 = movmskps(CONCAT31((int3)((uint)uVar16 >> 8),~(byte)uVar16),auVar26);
              if ((~(byte)uVar16 & 7) != 0) goto LAB_00aacedc;
              pfVar1 = (float *)(pcVar7 + lVar15);
              auVar27._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar27._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar27._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar27._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar16 = movmskps((int)pcVar7,auVar27);
              if ((~(byte)uVar16 & 7) != 0) goto LAB_00aacedc;
              uVar13 = uVar13 + 1;
              psVar19 = psVar19 + 7;
              bVar8 = (ulong)(long)(int)uVar18 < uVar13;
            } while (uVar13 <= (ulong)(long)(int)uVar18);
          }
          local_110.primID = &local_100;
          auVar39._0_4_ =
               (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.time_range.lower;
          fVar30 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.upper - auVar39._0_4_;
          fVar34 = (fVar3 - auVar39._0_4_) / fVar30;
          fVar30 = (fVar2 - auVar39._0_4_) / fVar30;
          auVar39._12_4_ = fVar37 * fVar30;
          local_110.this = this;
          local_100 = uVar23;
          auVar39._4_4_ = floorf(fVar37 * fVar34);
          auVar39._8_4_ = ceilf(auVar39._12_4_);
          auVar39._0_4_ = auVar39._4_4_;
          if (auVar39._4_4_ <= 0.0) {
            auVar39._0_4_ = 0.0;
          }
          auVar31._12_4_ = auVar39._8_4_;
          if (fVar37 <= auVar39._8_4_) {
            auVar31._12_4_ = fVar37;
          }
          uVar5 = (int)auVar39._4_4_;
          if ((int)auVar39._4_4_ < 0) {
            uVar5 = 0xffffffff;
          }
          iVar14 = (int)fVar37 + 1;
          if ((int)auVar39._8_4_ < (int)fVar37 + 1) {
            iVar14 = (int)auVar39._8_4_;
          }
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_d8.field_1,&local_110,(long)(int)auVar39._0_4_);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_f8.field_1,&local_110,(long)(int)auVar31._12_4_);
          auVar39._4_4_ = fVar37 * fVar34 - auVar39._0_4_;
          if (iVar14 - uVar5 == 1) {
            if (auVar39._4_4_ <= 0.0) {
              auVar39._4_4_ = 0.0;
            }
            fVar37 = 1.0 - auVar39._4_4_;
            auVar44._0_4_ = fVar37 * local_d8.m128[0] + auVar39._4_4_ * local_f8.m128[0];
            auVar44._4_4_ = fVar37 * local_d8.m128[1] + auVar39._4_4_ * local_f8.m128[1];
            auVar44._8_4_ = fVar37 * local_d8.m128[2] + auVar39._4_4_ * local_f8.m128[2];
            auVar44._12_4_ = fVar37 * local_d8.m128[3] + auVar39._4_4_ * local_f8.m128[3];
            auVar38._0_4_ = fVar37 * local_c8 + auVar39._4_4_ * local_e8;
            auVar38._4_4_ = fVar37 * fStack_c4 + auVar39._4_4_ * fStack_e4;
            auVar38._8_4_ = fVar37 * fStack_c0 + auVar39._4_4_ * fStack_e0;
            auVar38._12_4_ = fVar37 * fStack_bc + auVar39._4_4_ * fStack_dc;
            auVar31._12_4_ = auVar31._12_4_ - auVar39._12_4_;
            if (auVar31._12_4_ <= 0.0) {
              auVar31._12_4_ = 0.0;
            }
            fVar37 = 1.0 - auVar31._12_4_;
            auVar39._0_4_ = local_f8.m128[0] * fVar37 + local_d8.m128[0] * auVar31._12_4_;
            auVar39._4_4_ = local_f8.m128[1] * fVar37 + local_d8.m128[1] * auVar31._12_4_;
            auVar39._8_4_ = local_f8.m128[2] * fVar37 + local_d8.m128[2] * auVar31._12_4_;
            auVar39._12_4_ = local_f8.m128[3] * fVar37 + local_d8.m128[3] * auVar31._12_4_;
            auVar31._0_4_ = fVar37 * local_e8 + auVar31._12_4_ * local_c8;
            auVar31._4_4_ = fVar37 * fStack_e4 + auVar31._12_4_ * fStack_c4;
            auVar31._8_4_ = fVar37 * fStack_e0 + auVar31._12_4_ * fStack_c0;
            auVar31._12_4_ = fVar37 * fStack_dc + auVar31._12_4_ * fStack_bc;
            uVar12 = 1;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_110,(long)((int)auVar39._0_4_ + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_110,(long)((int)auVar31._12_4_ + -1));
            if (auVar39._4_4_ <= 0.0) {
              auVar39._4_4_ = 0.0;
            }
            auVar39._0_4_ = 1.0 - auVar39._4_4_;
            auVar44._0_4_ = local_d8.m128[0] * auVar39._0_4_ + local_58.m128[0] * auVar39._4_4_;
            auVar44._4_4_ = local_d8.m128[1] * auVar39._0_4_ + local_58.m128[1] * auVar39._4_4_;
            auVar44._8_4_ = local_d8.m128[2] * auVar39._0_4_ + local_58.m128[2] * auVar39._4_4_;
            auVar44._12_4_ = local_d8.m128[3] * auVar39._0_4_ + local_58.m128[3] * auVar39._4_4_;
            auVar38._0_4_ = auVar39._0_4_ * local_c8 + auVar39._4_4_ * local_48;
            auVar38._4_4_ = auVar39._0_4_ * fStack_c4 + auVar39._4_4_ * fStack_44;
            auVar38._8_4_ = auVar39._0_4_ * fStack_c0 + auVar39._4_4_ * fStack_40;
            auVar38._12_4_ = auVar39._0_4_ * fStack_bc + auVar39._4_4_ * fStack_3c;
            auVar31._12_4_ = auVar31._12_4_ - auVar39._12_4_;
            if (auVar31._12_4_ <= 0.0) {
              auVar31._12_4_ = 0.0;
            }
            fVar36 = 1.0 - auVar31._12_4_;
            auVar39._0_4_ = local_f8.m128[0] * fVar36 + local_78.m128[0] * auVar31._12_4_;
            auVar39._4_4_ = local_f8.m128[1] * fVar36 + local_78.m128[1] * auVar31._12_4_;
            auVar39._8_4_ = local_f8.m128[2] * fVar36 + local_78.m128[2] * auVar31._12_4_;
            auVar39._12_4_ = local_f8.m128[3] * fVar36 + local_78.m128[3] * auVar31._12_4_;
            auVar31._0_4_ = fVar36 * local_e8 + auVar31._12_4_ * local_68;
            auVar31._4_4_ = fVar36 * fStack_e4 + auVar31._12_4_ * fStack_64;
            auVar31._8_4_ = fVar36 * fStack_e0 + auVar31._12_4_ * fStack_60;
            auVar31._12_4_ = fVar36 * fStack_dc + auVar31._12_4_ * fStack_5c;
            uVar12 = uVar5 + 1;
            if ((int)uVar12 < iVar14) {
              sVar22 = (size_t)uVar12;
              iVar14 = ~uVar5 + iVar14;
              do {
                fVar36 = ((float)(int)sVar22 / fVar37 - fVar34) / (fVar30 - fVar34);
                fVar35 = 1.0 - fVar36;
                fVar47 = auVar44._4_4_;
                fVar48 = auVar44._8_4_;
                fVar49 = auVar44._12_4_;
                fVar41 = auVar38._4_4_;
                fVar42 = auVar38._8_4_;
                fVar43 = auVar38._12_4_;
                local_a8 = fVar35 * auVar38._0_4_ + fVar36 * auVar31._0_4_;
                fStack_a4 = fVar35 * fVar41 + fVar36 * auVar31._4_4_;
                fStack_a0 = fVar35 * fVar42 + fVar36 * auVar31._8_4_;
                fStack_9c = fVar35 * fVar43 + fVar36 * auVar31._12_4_;
                local_b8 = auVar39._0_4_;
                fStack_b4 = auVar39._4_4_;
                fStack_b0 = auVar39._8_4_;
                fStack_ac = auVar39._12_4_;
                pBVar11 = linearBounds::anon_class_16_2_07cfa4d6::operator()
                                    ((BBox3fa *)&local_98.field_1,&local_110,sVar22);
                uVar12 = (uint)pBVar11;
                auVar28._0_4_ = local_98.m128[0] - (auVar44._0_4_ * fVar35 + auVar39._0_4_ * fVar36)
                ;
                auVar28._4_4_ = local_98.m128[1] - (fVar47 * fVar35 + auVar39._4_4_ * fVar36);
                auVar28._8_4_ = local_98.m128[2] - (fVar48 * fVar35 + auVar39._8_4_ * fVar36);
                auVar28._12_4_ = local_98.m128[3] - (fVar49 * fVar35 + auVar39._12_4_ * fVar36);
                auVar32._0_4_ = local_88 - local_a8;
                auVar32._4_4_ = fStack_84 - fStack_a4;
                auVar32._8_4_ = fStack_80 - fStack_a0;
                auVar32._12_4_ = fStack_7c - fStack_9c;
                auVar45 = minps(auVar28,ZEXT816(0));
                auVar33 = maxps(auVar32,ZEXT816(0));
                auVar44._0_4_ = auVar44._0_4_ + auVar45._0_4_;
                auVar44._4_4_ = fVar47 + auVar45._4_4_;
                auVar44._8_4_ = fVar48 + auVar45._8_4_;
                auVar44._12_4_ = fVar49 + auVar45._12_4_;
                auVar39._0_4_ = auVar45._0_4_ + local_b8;
                auVar39._4_4_ = auVar45._4_4_ + fStack_b4;
                auVar39._8_4_ = auVar45._8_4_ + fStack_b0;
                auVar39._12_4_ = auVar45._12_4_ + fStack_ac;
                auVar38._0_4_ = auVar38._0_4_ + auVar33._0_4_;
                auVar38._4_4_ = fVar41 + auVar33._4_4_;
                auVar38._8_4_ = fVar42 + auVar33._8_4_;
                auVar38._12_4_ = fVar43 + auVar33._12_4_;
                auVar31._0_4_ = auVar33._0_4_ + auVar31._0_4_;
                auVar31._4_4_ = auVar33._4_4_ + auVar31._4_4_;
                auVar31._8_4_ = auVar33._8_4_ + auVar31._8_4_;
                auVar31._12_4_ = auVar33._12_4_ + auVar31._12_4_;
                sVar22 = sVar22 + 1;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            else {
            }
          }
          auVar9._4_4_ = -(uint)(auVar44._4_4_ <= auVar38._4_4_);
          auVar9._0_4_ = -(uint)(auVar44._0_4_ <= auVar38._0_4_);
          auVar9._8_4_ = -(uint)(auVar44._8_4_ <= auVar38._8_4_);
          auVar9._12_4_ = -(uint)(auVar44._12_4_ <= auVar38._12_4_);
          uVar16 = movmskps(uVar12,auVar9);
          if (((~(byte)uVar16 & 7) == 0) &&
             (auVar10._4_4_ = -(uint)(auVar39._4_4_ <= auVar31._4_4_),
             auVar10._0_4_ = -(uint)(auVar39._0_4_ <= auVar31._0_4_),
             auVar10._8_4_ = -(uint)(auVar39._8_4_ <= auVar31._8_4_),
             auVar10._12_4_ = -(uint)(auVar39._12_4_ <= auVar31._12_4_),
             uVar16 = movmskps(CONCAT31((int3)((uint)uVar16 >> 8),~(byte)uVar16),auVar10),
             (~(byte)uVar16 & 7) == 0)) {
            auVar45 = minps(auVar44,auVar39);
            auVar39 = maxps(auVar38,auVar31);
            aVar46._0_12_ = auVar45._0_12_;
            aVar46.m128[3] = (float)geomID;
            aVar40._0_12_ = auVar39._0_12_;
            aVar40.m128[3] = (float)uVar23;
            auVar29._0_4_ = auVar45._0_4_ + auVar39._0_4_;
            auVar29._4_4_ = auVar45._4_4_ + auVar39._4_4_;
            auVar29._8_4_ = auVar45._8_4_ + auVar39._8_4_;
            auVar29._12_4_ = (float)geomID + (float)uVar23;
            local_138 = minps(local_138,(undefined1  [16])aVar46);
            local_148 = maxps(local_148,(undefined1  [16])aVar40);
            local_158 = minps(local_158,auVar29);
            local_168 = maxps(local_168,auVar29);
            local_198 = local_198 + 1;
            prims[local_190].lower.field_0 = aVar46;
            prims[local_190].upper.field_0 = aVar40;
            local_190 = local_190 + 1;
          }
        }
LAB_00aad385:
        uVar23 = uVar23 + 1;
      } while (uVar23 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_138._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_138._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_148._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_148._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_158._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_158._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_168._8_8_;
    __return_storage_ptr__->end = local_198;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }